

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O0

void __thiscall cppnet::RWSocket::~RWSocket(RWSocket *this)

{
  bool bVar1;
  element_type *this_00;
  element_type *this_01;
  undefined1 local_20 [8];
  shared_ptr<cppnet::Dispatcher> dispatcher;
  RWSocket *this_local;
  
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__RWSocket_00167100;
  (this->super_CNSocket)._vptr_CNSocket = (_func_int **)&DAT_001671c0;
  dispatcher.super___shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::__shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->_write_buffer).
              super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->_read_buffer).
              super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_alloter);
  if ((bVar1) && (this->_event != (Event *)0x0)) {
    this_00 = std::
              __shared_ptr_access<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->_alloter);
    AlloterWrap::PoolDelete<cppnet::Event>(this_00,&this->_event);
  }
  if (this->_timer_id != 0) {
    Socket::GetDispatcher((Socket *)local_20);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_20);
    if (bVar1) {
      this_01 = std::
                __shared_ptr_access<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_20);
      Dispatcher::StopTimer(this_01,this->_timer_id);
    }
    this->_timer_id = 0;
    std::shared_ptr<cppnet::Dispatcher>::~shared_ptr((shared_ptr<cppnet::Dispatcher> *)local_20);
  }
  std::shared_ptr<cppnet::BlockMemoryPool>::~shared_ptr(&this->_block_pool);
  std::shared_ptr<cppnet::AlloterWrap>::~shared_ptr(&this->_alloter);
  std::shared_ptr<cppnet::BufferQueue>::~shared_ptr(&this->_read_buffer);
  std::shared_ptr<cppnet::BufferQueue>::~shared_ptr(&this->_write_buffer);
  std::enable_shared_from_this<cppnet::RWSocket>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<cppnet::RWSocket>);
  CNSocket::~CNSocket(&this->super_CNSocket);
  Socket::~Socket(&this->super_Socket);
  return;
}

Assistant:

RWSocket::~RWSocket() {
    _write_buffer.reset();
    _read_buffer.reset();
    if (_alloter && _event) {
        _alloter->PoolDelete(_event);
    }
    if (_timer_id > 0) {
        auto dispatcher = GetDispatcher();
        if (dispatcher) {
            dispatcher->StopTimer(_timer_id);
        }
        _timer_id = 0;
    }
}